

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O1

int SDL_CDResume(SDL12_CD *cdrom)

{
  AudioCallbackWrapperData *pAVar1;
  int iVar2;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 in_RSI;
  char *pcVar3;
  
  if (CDRomInit == '\x01') {
    if ((cdrom != (SDL12_CD *)0x0) || (cdrom = CDRomDevice, CDRomDevice != (SDL12_CD *)0x0))
    goto LAB_001128da;
    pcVar3 = "CD-ROM not opened";
  }
  else {
    pcVar3 = "CD-ROM subsystem not initialized";
  }
  cdrom = (SDL12_CD *)0x0;
  (*SDL20_SetError)(pcVar3);
  in_RDX = extraout_RDX;
LAB_001128da:
  if (cdrom == (SDL12_CD *)0x0) {
    iVar2 = -1;
  }
  else {
    if (cdrom->status == SDL12_CD_TRAYEMPTY) {
      iVar2 = (*SDL20_SetError)("Tray empty",in_RSI,in_RDX,SDL20_SetError);
      return iVar2;
    }
    (*SDL20_LockAudio)();
    pAVar1 = audio_cbdata;
    if (audio_cbdata != (AudioCallbackWrapperData *)0x0) {
      if (audio_cbdata->cdrom_status == SDL12_CD_PAUSED) {
        audio_cbdata->cdrom_status = SDL12_CD_PLAYING;
      }
      cdrom->status = pAVar1->cdrom_status;
    }
    (*SDL20_UnlockAudio)();
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

SDLCALL
SDL_CDResume(SDL12_CD *cdrom)
{
    if ((cdrom = ValidCDDevice(cdrom)) == NULL) {
        return -1;
    }
    if (cdrom->status == SDL12_CD_TRAYEMPTY) {
        return SDL20_SetError("Tray empty");
    }

    SDL20_LockAudio();
    if (audio_cbdata) {
        if (audio_cbdata->cdrom_status == SDL12_CD_PAUSED) {
            audio_cbdata->cdrom_status = SDL12_CD_PLAYING;
        }
        cdrom->status = audio_cbdata->cdrom_status;
    }
    SDL20_UnlockAudio();
    return 0;
}